

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::SchemaElement::printTo(SchemaElement *this,ostream *out)

{
  ostream *poVar1;
  type *val;
  type *val_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  type *val_01;
  string local_40;
  
  std::operator<<(out,"SchemaElement(");
  std::operator<<(out,"type=");
  if (((ushort)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->type,val);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"type_length=");
  if (((ushort)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_40,&this->type_length);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"repetition_type=");
  if (((ushort)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->repetition_type,val_00);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"name=");
  duckdb_apache::thrift::to_string<std::__cxx11::string>(&local_40,(thrift *)&this->name,t);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"num_children=");
  if (((ushort)this->__isset & 8) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_40,&this->num_children);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"converted_type=");
  if (((ushort)this->__isset & 0x10) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->converted_type,val_01);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"scale=");
  if (((ushort)this->__isset & 0x20) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_40,&this->scale);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"precision=");
  if (((ushort)this->__isset & 0x40) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_40,&this->precision);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"field_id=");
  if (((ushort)this->__isset & 0x80) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_40,&this->field_id);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"logicalType=");
  if (((this->__isset).field_0x1 & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::LogicalType>(&local_40,&this->logicalType);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void SchemaElement::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SchemaElement(";
  out << "type="; (__isset.type ? (out << to_string(type)) : (out << "<null>"));
  out << ", " << "type_length="; (__isset.type_length ? (out << to_string(type_length)) : (out << "<null>"));
  out << ", " << "repetition_type="; (__isset.repetition_type ? (out << to_string(repetition_type)) : (out << "<null>"));
  out << ", " << "name=" << to_string(name);
  out << ", " << "num_children="; (__isset.num_children ? (out << to_string(num_children)) : (out << "<null>"));
  out << ", " << "converted_type="; (__isset.converted_type ? (out << to_string(converted_type)) : (out << "<null>"));
  out << ", " << "scale="; (__isset.scale ? (out << to_string(scale)) : (out << "<null>"));
  out << ", " << "precision="; (__isset.precision ? (out << to_string(precision)) : (out << "<null>"));
  out << ", " << "field_id="; (__isset.field_id ? (out << to_string(field_id)) : (out << "<null>"));
  out << ", " << "logicalType="; (__isset.logicalType ? (out << to_string(logicalType)) : (out << "<null>"));
  out << ")";
}